

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
unaryExpression(Tokenizer *tokenizer)

{
  TokenType TVar1;
  undefined8 __p;
  Token *pTVar2;
  Tokenizer *in_RSI;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  undefined1 local_30 [16];
  
  postfixExpression((Tokenizer *)local_30);
  if ((ExpressionInternal *)local_30._0_8_ == (ExpressionInternal *)0x0) {
    pTVar2 = Tokenizer::nextToken(in_RSI);
    TVar1 = pTVar2->type;
    postfixExpression((Tokenizer *)(local_30 + 8));
    __p = local_30._8_8_;
    local_30._8_8_ = (pointer)0x0;
    std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
              ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               local_30,(pointer)__p);
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
               (local_30 + 8));
    if ((ExpressionInternal *)local_30._0_8_ != (ExpressionInternal *)0x0) {
      if (TVar1 == Degree) {
        local_30._8_4_ = 0x1c;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_30 + 8));
        goto LAB_0013e4d9;
      }
      if (TVar1 == Minus) {
        local_30._8_4_ = 0xb;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_30 + 8));
        goto LAB_0013e4d9;
      }
      if (TVar1 == Tilde) {
        local_30._8_4_ = 0xd;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_30 + 8));
        goto LAB_0013e4d9;
      }
      if (TVar1 == Exclamation) {
        local_30._8_4_ = 0xc;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)tokenizer,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_30 + 8));
        goto LAB_0013e4d9;
      }
      if (TVar1 == Plus) goto LAB_0013e470;
    }
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
LAB_0013e470:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)local_30._0_8_;
    local_30._0_8_ =
         (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
  }
LAB_0013e4d9:
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_30);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> unaryExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = postfixExpression(tokenizer);
	if (exp != nullptr)
		return exp;

	const TokenType opType = tokenizer.nextToken().type;
	exp = postfixExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	switch (opType)
	{
	case TokenType::Plus:
		return exp;
	case TokenType::Minus:
		return std::make_unique<ExpressionInternal>(OperatorType::Neg, std::move(exp));
	case TokenType::Tilde:
		return std::make_unique<ExpressionInternal>(OperatorType::BitNot, std::move(exp));
	case TokenType::Exclamation:
		return std::make_unique<ExpressionInternal>(OperatorType::LogNot, std::move(exp));
	case TokenType::Degree:
		return std::make_unique<ExpressionInternal>(OperatorType::ToString, std::move(exp));
	default:
		return nullptr;
	}
}